

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O3

void init_test_get(VMEMcache *cache,uint n_threads,os_thread_t *threads,uint ops_per_thread,
                  context *ctx)

{
  uint uVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  ulong local_48;
  unsigned_long_long n_key;
  uint local_38;
  int cache_is_full;
  
  lVar3 = CONCAT44(in_register_0000000c,ops_per_thread);
  local_38 = n_threads;
  free_cache(cache);
  n_key._4_4_ = 0;
  vmemcache_callback_on_evict(cache,on_evict_cb,(long)&n_key + 4);
  uVar6 = 0;
  printf("%s: filling the pool...","init_test_get");
  fflush(_stdout);
  iVar2 = (int)threads;
  bVar7 = iVar2 != 0;
  if (bVar7 && n_key._4_4_ == 0) {
    uVar6 = 0;
    cache_is_full = iVar2;
    do {
      lVar5 = ((uVar6 & 0xffffffff) % (ulong)*(uint *)(lVar3 + 0x18)) * 0x10;
      puVar4 = *(undefined4 **)(*(long *)(lVar3 + 0x10) + 8 + lVar5);
      local_48 = uVar6;
      iVar2 = vmemcache_put(cache,&local_48,8,puVar4,
                            *(undefined8 *)(*(long *)(lVar3 + 0x10) + lVar5));
      if (iVar2 != 0) {
        init_test_get_cold_1();
        *puVar4 = 1;
        return;
      }
      uVar6 = uVar6 + 1;
      bVar7 = uVar6 < ((ulong)threads & 0xffffffff);
      iVar2 = cache_is_full;
    } while ((n_key._4_4_ == 0) && (uVar6 < ((ulong)threads & 0xffffffff)));
  }
  printf(" done (inserted %u elements)\n",uVar6 & 0xffffffff);
  vmemcache_callback_on_evict(cache,0,0);
  uVar1 = local_38;
  if (bVar7) {
    printf("%s: decreasing ops_count to: %u\n","init_test_get",(ulong)((int)uVar6 * local_38));
    iVar2 = (int)uVar6;
  }
  if (uVar1 != 0) {
    lVar5 = 0;
    do {
      *(code **)(lVar3 + 0x20 + lVar5) = worker_thread_get;
      *(int *)(lVar3 + 0x1c + lVar5) = iVar2;
      lVar5 = lVar5 + 0x28;
    } while ((ulong)uVar1 * 0x28 != lVar5);
  }
  return;
}

Assistant:

static void
init_test_get(VMEMcache *cache, unsigned n_threads, os_thread_t *threads,
		unsigned ops_per_thread, struct context *ctx)
{
	free_cache(cache);

	int cache_is_full = 0;
	vmemcache_callback_on_evict(cache, on_evict_cb, &cache_is_full);

	printf("%s: filling the pool...", __func__);
	fflush(stdout);

	unsigned n = 0; /* number of elements put into the cache */
	while (!cache_is_full && n < ops_per_thread) {
		unsigned long long n_key = n;
		if (vmemcache_put(cache, &n_key, sizeof(n_key),
					ctx->buffs[n % ctx->nbuffs].buff,
					ctx->buffs[n % ctx->nbuffs].size))
			UT_FATAL("ERROR: vmemcache_put: %s",
					vmemcache_errormsg());
		n++;
	}

	printf(" done (inserted %u elements)\n", n);

	vmemcache_callback_on_evict(cache, NULL, NULL);

	if (ops_per_thread > n) {
		/* we cannot get more than we have put */
		ops_per_thread = n;
		printf("%s: decreasing ops_count to: %u\n",
			__func__, n_threads * ops_per_thread);
	}

	for (unsigned i = 0; i < n_threads; ++i) {
		ctx[i].worker = worker_thread_get;
		ctx[i].ops_count = ops_per_thread;
	}
}